

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
               (int field_number,string *value,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  LogMessage *other;
  ulong uVar3;
  uint8 *puVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  ulong uVar8;
  LogMessage local_60;
  LogFinisher local_21;
  
  uVar7 = field_number << 3;
  pbVar5 = output->cur_;
  if ((output->impl_).end_ <= pbVar5) {
    pbVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar5);
  }
  if (uVar7 < 0x80) {
    *pbVar5 = (byte)uVar7 | 2;
    pbVar5 = pbVar5 + 1;
  }
  else {
    *pbVar5 = (byte)uVar7 | 0x82;
    if (uVar7 < 0x4000) {
      pbVar5[1] = (byte)(uVar7 >> 7);
      pbVar5 = pbVar5 + 2;
    }
    else {
      pbVar5 = pbVar5 + 2;
      uVar7 = uVar7 >> 7;
      do {
        pbVar6 = pbVar5;
        pbVar6[-1] = (byte)uVar7 | 0x80;
        uVar2 = uVar7 >> 7;
        pbVar5 = pbVar6 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar2;
      } while (bVar1);
      *pbVar6 = (byte)uVar2;
    }
  }
  output->cur_ = pbVar5;
  uVar8 = value->_M_string_length;
  if ((uVar8 & 0xffffffff80000000) != 0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/wire_format_lite.cc"
               ,0x1eb);
    other = LogMessage::operator<<(&local_60,"CHECK failed: (value.size()) <= (kint32max): ");
    LogFinisher::operator=(&local_21,other);
    LogMessage::~LogMessage(&local_60);
    uVar8 = value->_M_string_length;
    pbVar5 = output->cur_;
  }
  if ((output->impl_).end_ <= pbVar5) {
    pbVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar5);
  }
  if ((uint)uVar8 < 0x80) {
    *pbVar5 = (byte)uVar8;
    pbVar5 = pbVar5 + 1;
  }
  else {
    *pbVar5 = (byte)uVar8 | 0x80;
    uVar3 = uVar8 >> 7 & 0x1ffffff;
    if ((uint)uVar8 < 0x4000) {
      pbVar5[1] = (byte)uVar3;
      pbVar5 = pbVar5 + 2;
    }
    else {
      pbVar5 = pbVar5 + 2;
      do {
        pbVar6 = pbVar5;
        uVar7 = (uint)uVar3;
        pbVar6[-1] = (byte)uVar3 | 0x80;
        uVar2 = uVar7 >> 7;
        uVar3 = (ulong)uVar2;
        pbVar5 = pbVar6 + 1;
      } while (0x3fff < uVar7);
      *pbVar6 = (byte)uVar2;
    }
  }
  output->cur_ = pbVar5;
  puVar4 = io::EpsCopyOutputStream::WriteRawMaybeAliased
                     (&output->impl_,(value->_M_dataplus)._M_p,(int)value->_M_string_length,pbVar5);
  output->cur_ = puVar4;
  return;
}

Assistant:

void WireFormatLite::WriteStringMaybeAliased(int field_number,
                                             const std::string& value,
                                             io::CodedOutputStream* output) {
  // String is for UTF-8 text only
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK_LE(value.size(), kint32max);
  output->WriteVarint32(value.size());
  output->WriteRawMaybeAliased(value.data(), value.size());
}